

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O0

void __thiscall absl::lts_20250127::crc_internal::CRC32::Scramble(CRC32 *this,uint32_t *crc)

{
  uint uVar1;
  uint uVar2;
  int scramble_rotate;
  uint32_t *crc_local;
  CRC32 *this_local;
  
  uVar1 = RotateRight<unsigned_int>(*crc + 0x2e76e41b,0x20,0x11);
  uVar2 = MaskOfLength<unsigned_int>(0x20);
  *crc = uVar1 & uVar2;
  return;
}

Assistant:

void CRC32::Scramble(uint32_t* crc) const {
  // Rotate by near half the word size plus 1.  See the scramble comment in
  // crc_internal.h for an explanation.
  constexpr int scramble_rotate = (32 / 2) + 1;
  *crc = RotateRight<uint32_t>(static_cast<unsigned int>(*crc + kScrambleLo),
                               32, scramble_rotate) &
         MaskOfLength<uint32_t>(32);
}